

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qscopedpointer.h
# Opt level: O2

void __thiscall QLineEdit::setEchoMode(QLineEdit *this,EchoMode mode)

{
  long lVar1;
  InputMethodHints IVar2;
  uint uVar3;
  QFlagsStorage<Qt::InputMethodHint> hints;
  
  lVar1 = *(long *)&(this->super_QWidget).field_0x8;
  if ((*(uint *)(*(long *)(lVar1 + 600) + 0x50) >> 4 & PasswordEchoOnEdit) == mode) {
    return;
  }
  IVar2 = QWidget::inputMethodHints(&this->super_QWidget);
  if (mode - NoEcho < 2) {
    uVar3 = (uint)IVar2.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                  super_QFlagsStorage<Qt::InputMethodHint>.i | 5;
  }
  else {
    if (mode == Normal) {
      hints.i = (uint)IVar2.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                      super_QFlagsStorage<Qt::InputMethodHint>.i & 0xffffffb8;
      goto LAB_003eb7ac;
    }
    uVar3 = (uint)IVar2.super_QFlagsStorageHelper<Qt::InputMethodHint,_4>.
                  super_QFlagsStorage<Qt::InputMethodHint>.i & 0xfffffffa | 4;
  }
  hints.i = uVar3 | 0x42;
LAB_003eb7ac:
  QWidget::setInputMethodHints(&this->super_QWidget,(InputMethodHints)hints.i);
  QWidgetLineControl::setEchoMode(*(QWidgetLineControl **)(lVar1 + 600),mode);
  QWidget::update(&this->super_QWidget);
  return;
}

Assistant:

T *get() const noexcept
    {
        return d;
    }